

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlChar *ret;
  xmlDocPtr doc;
  xmlAttrPtr attr;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      attr = (xmlAttrPtr)reader->node;
    }
    else {
      attr = (xmlAttrPtr)reader->curnode;
    }
    xVar1 = attr->type;
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      ret = (xmlChar *)0x0;
      if (attr->children == (_xmlNode *)0x0) {
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        if (attr->parent != (_xmlNode *)0x0) {
          ret = (xmlChar *)attr->parent->doc;
        }
        reader_local = (xmlTextReaderPtr)xmlNodeListGetString((xmlDocPtr)ret,attr->children,1);
        if (reader_local == (xmlTextReaderPtr)0x0) {
          xmlTextReaderErrMemory(reader);
        }
      }
    }
    else if ((xVar1 - XML_TEXT_NODE < 2) || (xVar1 - XML_PI_NODE < 2)) {
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)&attr->atype);
    }
    else if (xVar1 == XML_NAMESPACE_DECL) {
      reader_local = (xmlTextReaderPtr)readerStrdup(reader,attr->name);
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(readerStrdup(reader, ((xmlNsPtr) node)->href));
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
            xmlDocPtr doc = NULL;
            xmlChar *ret;

            if (attr->children == NULL)
                return(NULL);
	    if (attr->parent != NULL)
                doc = attr->parent->doc;
	    ret = xmlNodeListGetString(doc, attr->children, 1);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            return(readerStrdup(reader, node->content));
	default:
	    break;
    }
    return(NULL);
}